

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DynamicMapField::DeleteMapValue(DynamicMapField *this,MapKey *map_key)

{
  iterator pos;
  undefined8 in_RSI;
  size_type in_RDI;
  iterator iter;
  iterator *in_stack_ffffffffffffff68;
  MapFieldBase *in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffff88;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffff90;
  MapValueRef *in_stack_ffffffffffffffc0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe0;
  bool local_1;
  
  MapFieldBase::SyncMapWithRepeatedField(in_stack_ffffffffffffff70);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(in_stack_ffffffffffffff90);
  local_1 = protobuf::operator==((iterator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (!local_1) {
    MapFieldBase::SetMapDirty((MapFieldBase *)0x417bf0);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
              ((iterator *)0x417bfa);
    MapValueRef::DeleteData(in_stack_ffffffffffffffc0);
    pos.it_.m_ = (InnerMap *)in_RSI;
    pos.it_.node_ = (Node *)in_stack_ffffffffffffffe0;
    pos.it_.bucket_index_ = in_RDI;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
              (in_stack_ffffffffffffffd0,pos);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool DynamicMapField::DeleteMapValue(const MapKey& map_key) {
  MapFieldBase::SyncMapWithRepeatedField();
  Map<MapKey, MapValueRef>::iterator iter = map_.find(map_key);
  if (iter == map_.end()) {
    return false;
  }
  // Set map dirty only if the delete is successful.
  MapFieldBase::SetMapDirty();
  iter->second.DeleteData();
  map_.erase(iter);
  return true;
}